

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_delay_init(ma_delay_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                       ma_delay *pDelay)

{
  ma_uint32 mVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ma_uint32 mVar5;
  ma_uint32 mVar6;
  ma_bool32 mVar7;
  float *__s;
  size_t __n;
  ma_result mVar8;
  ulong __size;
  
  mVar8 = MA_INVALID_ARGS;
  if (pDelay != (ma_delay *)0x0) {
    *(undefined8 *)&pDelay->bufferSizeInFrames = 0;
    pDelay->pBuffer = (float *)0x0;
    (pDelay->config).wet = 0.0;
    (pDelay->config).dry = 0.0;
    *(undefined8 *)&(pDelay->config).decay = 0;
    (pDelay->config).channels = 0;
    (pDelay->config).sampleRate = 0;
    (pDelay->config).delayInFrames = 0;
    (pDelay->config).delayStart = 0;
    if (((pConfig != (ma_delay_config *)0x0) && (0.0 <= pConfig->decay)) && (pConfig->decay <= 1.0))
    {
      mVar1 = pConfig->channels;
      mVar5 = pConfig->sampleRate;
      mVar6 = pConfig->delayInFrames;
      mVar7 = pConfig->delayStart;
      fVar2 = pConfig->wet;
      fVar3 = pConfig->dry;
      fVar4 = pConfig->decay;
      (pDelay->config).delayStart = pConfig->delayStart;
      (pDelay->config).wet = fVar2;
      (pDelay->config).dry = fVar3;
      (pDelay->config).decay = fVar4;
      (pDelay->config).channels = mVar1;
      (pDelay->config).sampleRate = mVar5;
      (pDelay->config).delayInFrames = mVar6;
      (pDelay->config).delayStart = mVar7;
      mVar1 = pConfig->delayInFrames;
      pDelay->bufferSizeInFrames = mVar1;
      pDelay->cursor = 0;
      __size = (ulong)(mVar1 * pConfig->channels * 4);
      if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
        __s = (float *)malloc(__size);
      }
      else if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
        __s = (float *)0x0;
      }
      else {
        __s = (float *)(*pAllocationCallbacks->onMalloc)(__size,pAllocationCallbacks->pUserData);
      }
      pDelay->pBuffer = __s;
      if (__s == (float *)0x0) {
        mVar8 = MA_OUT_OF_MEMORY;
      }
      else {
        __n = (ulong)(pConfig->channels << 2) * (ulong)pDelay->bufferSizeInFrames;
        mVar8 = MA_SUCCESS;
        if (__n != 0) {
          memset(__s,0,__n);
          mVar8 = MA_SUCCESS;
        }
      }
    }
  }
  return mVar8;
}

Assistant:

MA_API ma_result ma_delay_init(const ma_delay_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_delay* pDelay)
{
    if (pDelay == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pDelay);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->decay < 0 || pConfig->decay > 1) {
        return MA_INVALID_ARGS;
    }

    pDelay->config             = *pConfig;
    pDelay->bufferSizeInFrames = pConfig->delayInFrames;
    pDelay->cursor             = 0;

    pDelay->pBuffer = (float*)ma_malloc((size_t)(pDelay->bufferSizeInFrames * ma_get_bytes_per_frame(ma_format_f32, pConfig->channels)), pAllocationCallbacks);
    if (pDelay->pBuffer == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    ma_silence_pcm_frames(pDelay->pBuffer, pDelay->bufferSizeInFrames, ma_format_f32, pConfig->channels);

    return MA_SUCCESS;
}